

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::gripMoved(QColumnViewPrivate *this,int offset)

{
  int iVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  pointer piVar8;
  int iVar9;
  int i;
  ulong uVar10;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar6 = (QWidget *)QObject::sender();
  bVar3 = QWidget::isRightToLeft(this_00);
  iVar9 = -offset;
  if (!bVar3) {
    iVar9 = offset;
  }
  uVar10 = 0;
  bVar3 = false;
  do {
    if ((ulong)(this->columns).d.size <= uVar10) {
      updateScrollbars(this);
      return;
    }
    pQVar7 = (QWidget *)(this->columns).d.ptr[uVar10];
    if (bVar3) {
      iVar5 = QWidget::x(pQVar7);
      pQVar7 = (QWidget *)(this->columns).d.ptr[uVar10];
LAB_00509852:
      QWidget::move(pQVar7,iVar5 + iVar9,0);
      bVar3 = true;
    }
    else {
      pQVar7 = QAbstractScrollArea::cornerWidget((QAbstractScrollArea *)pQVar7);
      if (pQVar7 == pQVar6) {
        pQVar2 = ((this->columns).d.ptr[uVar10]->super_QAbstractScrollArea).super_QFrame.
                 super_QWidget.data;
        iVar5 = (pQVar2->crect).x2.m_i;
        iVar1 = (pQVar2->crect).x1.m_i;
        piVar8 = QList<int>::data(&this->columnSizes);
        piVar8[uVar10] = (iVar5 - iVar1) + 1;
        bVar4 = QWidget::isRightToLeft(this_00);
        bVar3 = true;
        if (bVar4) {
          pQVar7 = (QWidget *)(this->columns).d.ptr[uVar10];
          iVar5 = QWidget::x(pQVar7);
          goto LAB_00509852;
        }
      }
      else {
        bVar3 = false;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void QColumnViewPrivate::gripMoved(int offset)
{
    Q_Q(QColumnView);

    QObject *grip = q->sender();
    Q_ASSERT(grip);

    if (q->isRightToLeft())
        offset = -1 * offset;

    bool found = false;
    for (int i = 0; i < columns.size(); ++i) {
        if (!found && columns.at(i)->cornerWidget() == grip) {
            found = true;
            columnSizes[i] = columns.at(i)->width();
            if (q->isRightToLeft())
                columns.at(i)->move(columns.at(i)->x() + offset, 0);
            continue;
        }
        if (!found)
            continue;

        int currentX = columns.at(i)->x();
        columns.at(i)->move(currentX + offset, 0);
    }

    updateScrollbars();
}